

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

void __thiscall
dgMatrix::TransformBBox
          (dgMatrix *this,dgVector *p0local,dgVector *p1local,dgVector *p0,dgVector *p1)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  dgVector box [8];
  uint auStack_a0 [2];
  float local_98 [32];
  
  local_98[0] = (p0local->super_dgTemplateVector<float>).m_x;
  local_98[1] = (p0local->super_dgTemplateVector<float>).m_y;
  local_98[2] = (p0local->super_dgTemplateVector<float>).m_z;
  local_98[3] = 1.0;
  local_98[6] = (p1local->super_dgTemplateVector<float>).m_z;
  local_98[9] = (p1local->super_dgTemplateVector<float>).m_y;
  local_98[0xb] = 1.0;
  local_98[0xf] = 1.0;
  local_98[0x10] = (p1local->super_dgTemplateVector<float>).m_x;
  local_98[0x13] = 1.0;
  local_98[7] = 1.0;
  local_98[0x1b] = 1.0;
  local_98[0x1f] = 1.0;
  auStack_a0[0] = 0x879bab;
  auStack_a0[1] = 0;
  local_98[4] = local_98[0];
  local_98[5] = local_98[1];
  local_98[8] = local_98[0];
  local_98[10] = local_98[2];
  local_98[0xc] = local_98[0];
  local_98[0xd] = local_98[9];
  local_98[0xe] = local_98[6];
  local_98[0x11] = local_98[1];
  local_98[0x12] = local_98[2];
  local_98[0x14] = local_98[0x10];
  local_98[0x15] = local_98[1];
  local_98[0x16] = local_98[6];
  local_98[0x18] = local_98[0x10];
  local_98[0x19] = local_98[9];
  local_98[0x1a] = local_98[2];
  local_98[0x1c] = local_98[0x10];
  local_98[0x1d] = local_98[9];
  local_98[0x1e] = local_98[6];
  TransformTriplex(this,(HaF32 *)local_98,0x10,(HaF32 *)local_98,0x10,8);
  (p0->super_dgTemplateVector<float>).m_x = local_98[0];
  (p0->super_dgTemplateVector<float>).m_y = local_98[1];
  (p0->super_dgTemplateVector<float>).m_z = local_98[2];
  (p0->super_dgTemplateVector<float>).m_w = local_98[3];
  (p1->super_dgTemplateVector<float>).m_x = local_98[0];
  (p1->super_dgTemplateVector<float>).m_y = local_98[1];
  (p1->super_dgTemplateVector<float>).m_z = local_98[2];
  (p1->super_dgTemplateVector<float>).m_w = local_98[3];
  lVar4 = 0x18;
  do {
    uVar1 = *(uint *)((long)auStack_a0 + lVar4);
    auVar3 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_x));
    (p0->super_dgTemplateVector<float>).m_x = auVar3._0_4_;
    auVar5 = ZEXT416(*(uint *)((long)auStack_a0 + lVar4 + 4));
    auVar3 = vminss_avx(auVar5,ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_y));
    (p0->super_dgTemplateVector<float>).m_y = auVar3._0_4_;
    uVar2 = *(uint *)((long)local_98 + lVar4);
    auVar3 = vminss_avx(ZEXT416(uVar2),ZEXT416((uint)(p0->super_dgTemplateVector<float>).m_z));
    (p0->super_dgTemplateVector<float>).m_z = auVar3._0_4_;
    auVar3 = vmaxss_avx(ZEXT416(uVar1),ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_x));
    (p1->super_dgTemplateVector<float>).m_x = auVar3._0_4_;
    auVar3 = vmaxss_avx(auVar5,ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_y));
    (p1->super_dgTemplateVector<float>).m_y = auVar3._0_4_;
    auVar3 = vmaxss_avx(ZEXT416(uVar2),ZEXT416((uint)(p1->super_dgTemplateVector<float>).m_z));
    (p1->super_dgTemplateVector<float>).m_z = auVar3._0_4_;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x88);
  return;
}

Assistant:

void dgMatrix::TransformBBox (const dgVector& p0local, const dgVector& p1local, dgVector& p0, dgVector& p1) const
{
	dgVector box[8];

	box[0][0] = p0local[0];
	box[0][1] = p0local[1];
	box[0][2] = p0local[2];
	box[0][3] = hacd::HaF32(1.0f);

	box[1][0] = p0local[0];
	box[1][1] = p0local[1];
	box[1][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[2][0] = p0local[0];
	box[2][1] = p1local[1];
	box[2][2] = p0local[2];
	box[2][3] = hacd::HaF32(1.0f);

	box[3][0] = p0local[0];
	box[3][1] = p1local[1];
	box[3][2] = p1local[2];
	box[3][3] = hacd::HaF32(1.0f);

	box[4][0] = p1local[0];
	box[4][1] = p0local[1];
	box[4][2] = p0local[2];
	box[4][3] = hacd::HaF32(1.0f);

	box[5][0] = p1local[0];
	box[5][1] = p0local[1];
	box[5][2] = p1local[2];
	box[1][3] = hacd::HaF32(1.0f);

	box[6][0] = p1local[0];
	box[6][1] = p1local[1];
	box[6][2] = p0local[2];
	box[6][3] = hacd::HaF32(1.0f);

	box[7][0] = p1local[0];
	box[7][1] = p1local[1];
	box[7][2] = p1local[2];
	box[7][3] = hacd::HaF32(1.0f);

	TransformTriplex (&box[0].m_x, sizeof (dgVector), &box[0].m_x, sizeof (dgVector), 8);

	p0 = box[0];
	p1 = box[0];
	for (hacd::HaI32 i = 1; i < 8; i ++) {
		p0.m_x = GetMin (p0.m_x, box[i].m_x);
		p0.m_y = GetMin (p0.m_y, box[i].m_y);
		p0.m_z = GetMin (p0.m_z, box[i].m_z);

		p1.m_x = GetMax (p1.m_x, box[i].m_x);
		p1.m_y = GetMax (p1.m_y, box[i].m_y);
		p1.m_z = GetMax (p1.m_z, box[i].m_z);
	}
}